

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O2

UnitQuaternion *
composeQuaternion(UnitQuaternion *__return_storage_ptr__,UnitQuaternion *q1,UnitQuaternion *q2)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  Vector3 imagOut;
  Vector3 v_1;
  Vector3 v;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_138;
  double local_128;
  double dStack_120;
  double local_118;
  Vector3 local_110;
  Vector3 local_f8;
  Vector3 local_d8;
  double local_b8;
  double dStack_b0;
  Vector3 *local_a8;
  scalar_constant_op<double> local_90;
  Vector3 *local_80;
  scalar_constant_op<double> local_68;
  Vector3 *local_50;
  
  dVar1 = q1->m_data[0];
  local_d8.m_data[0] = q1->m_data[1];
  local_d8.m_data[1] = q1->m_data[2];
  local_d8.m_data[2] = q1->m_data[3];
  dVar2 = q2->m_data[0];
  local_f8.m_data[0] = q2->m_data[1];
  local_f8.m_data[1] = q2->m_data[2];
  local_f8.m_data[2] = q2->m_data[3];
  crossVector(&local_110,&local_d8,&local_f8);
  local_138._0_8_ = &local_128;
  local_a8 = &local_f8;
  local_90.m_other = dVar1;
  local_80 = &local_d8;
  local_68.m_other = dVar2;
  local_50 = &local_110;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
            (&local_138,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_b8);
  local_a8 = (Vector3 *)local_d8.m_data[2];
  local_b8 = local_d8.m_data[0];
  dStack_b0 = local_d8.m_data[1];
  local_138._0_8_ = &local_f8;
  local_110.m_data[0] = (double)&local_b8;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&local_110,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&local_138);
  __return_storage_ptr__->m_data[0] = dVar1 * dVar2 - RVar3;
  __return_storage_ptr__->m_data[1] = local_128;
  __return_storage_ptr__->m_data[2] = dStack_120;
  __return_storage_ptr__->m_data[3] = local_118;
  return __return_storage_ptr__;
}

Assistant:

iDynTree::UnitQuaternion composeQuaternion(const iDynTree::UnitQuaternion &q1, const iDynTree::UnitQuaternion &q2)
{
    using iDynTree::toEigen;

    double s1 = realPartOfQuaternion(q1);
    iDynTree::Vector3 v1 = imaginaryPartOfQuaternion(q1);

    double s2 = realPartOfQuaternion(q2);
    iDynTree::Vector3 v2 = imaginaryPartOfQuaternion(q2);

    iDynTree::Vector3 imagOut;
    toEigen(imagOut) = toEigen(v2)*s1 + toEigen(v1)*s2 + toEigen(crossVector(v1, v2)); // to be read as imagOut = v2*s1 + v1*s2 + crossVector(v1, v2)

    iDynTree::UnitQuaternion out;
    out(0) = s1*s2 - innerProduct(v1, v2);
    out(1) = imagOut(0);
    out(2) = imagOut(1);
    out(3) = imagOut(2);

    return out;
}